

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotation_test_util.cc
# Opt level: O2

bool google::protobuf::compiler::annotation_test_util::DecodeMetadata
               (string *path,GeneratedCodeInfo *info)

{
  bool bVar1;
  Nonnull<const_char_*> failure_msg;
  ArrayInputStream input;
  string data;
  
  data._M_dataplus._M_p = (pointer)&data.field_2;
  data._M_string_length = 0;
  data.field_2._M_local_buf[0] = '\0';
  File::ReadFileToString((File *)&input,path,&data,false);
  if (input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream == (_func_int **)0x1) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                            ((Nonnull<const_absl::Status_*>)&input,
                             "File::GetContents(path, &data, true) is OK");
  }
  absl::lts_20250127::Status::~Status((Status *)&input);
  if (input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream == (_func_int **)0x1) {
    io::ArrayInputStream::ArrayInputStream
              (&input,data._M_dataplus._M_p,(int)data._M_string_length,-1);
    bVar1 = MessageLite::ParseFromZeroCopyStream
                      ((MessageLite *)info,&input.super_ZeroCopyInputStream);
    std::__cxx11::string::~string((string *)&data);
    return bVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&input,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/annotation_test_util.cc"
             ,0x4c,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&input);
}

Assistant:

bool DecodeMetadata(const std::string& path, GeneratedCodeInfo* info) {
  std::string data;
  ABSL_CHECK_OK(File::GetContents(path, &data, true));
  io::ArrayInputStream input(data.data(), data.size());
  return info->ParseFromZeroCopyStream(&input);
}